

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalcrules.cpp
# Opt level: O0

void __thiscall fmcalc::init_profile(fmcalc *this)

{
  FILE *__stream;
  long lVar1;
  char *__filename;
  FILE *__stream_00;
  undefined8 uVar2;
  size_t sVar3;
  undefined1 local_e4 [8];
  fm_profile d;
  int i;
  fm_profile f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [55];
  allocator local_39;
  string local_38 [8];
  string file;
  FILE *fin;
  fmcalc *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"input/fm_profile.bin",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 0) {
    std::__cxx11::string::substr((ulong)&f.share2,(ulong)local_38);
    std::operator+(local_70,&this->inputpath_);
    std::__cxx11::string::operator=(local_38,(string *)local_70);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)&f.share2);
  }
  __filename = (char *)std::__cxx11::string::c_str();
  __stream_00 = fopen(__filename,"rb");
  __stream = _stderr;
  if (__stream_00 == (FILE *)0x0) {
    uVar2 = std::__cxx11::string::c_str();
    fprintf(__stream,"%s: cannot open %s\n","init_profile",uVar2);
    exit(1);
  }
  fm_profile::fm_profile((fm_profile *)&d.share3);
  sVar3 = fread(&d.share3,0x28,1,__stream_00);
  d.share2 = (OASIS_FLOAT)sVar3;
  while (d.share2 != 0.0) {
    init_profile_rec(this,(fm_profile *)&d.share3);
    if (this->noop_profile_id < (int)d.share3) {
      this->noop_profile_id = (int)d.share3;
    }
    sVar3 = fread(&d.share3,0x28,1,__stream_00);
    d.share2 = (OASIS_FLOAT)sVar3;
  }
  this->noop_profile_id = this->noop_profile_id + 1;
  fm_profile::fm_profile((fm_profile *)local_e4);
  local_e4._0_4_ = this->noop_profile_id;
  local_e4._4_4_ = 100;
  init_profile_rec(this,(fm_profile *)local_e4);
  fclose(__stream_00);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void fmcalc::init_profile()
{
	FILE *fin = NULL;
	std::string file = FMPROFILE_FILE;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	fin = fopen(file.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "%s: cannot open %s\n", __func__, file.c_str());
		exit(EXIT_FAILURE);
	}
	fm_profile f;
	int i = fread(&f, sizeof(f), 1, fin);
	while (i != 0) {		
		init_profile_rec(f);
		if (noop_profile_id < f.profile_id) noop_profile_id = f.profile_id;
		i = fread(&f, sizeof(f), 1, fin);
	}
	noop_profile_id++;
	fm_profile d;	// dummy
	d.profile_id = noop_profile_id;
	//d.calcrule_id = 14;
	d.calcrule_id = 100; // noop
	init_profile_rec(d);
	fclose(fin);
}